

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixNormalsStep.cpp
# Opt level: O2

bool __thiscall
Assimp::FixInfacingNormalsProcess::ProcessMesh
          (FixInfacingNormalsProcess *this,aiMesh *pcMesh,uint index)

{
  uint uVar1;
  aiVector3D *paVar2;
  aiFace *paVar3;
  uint *puVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  Logger *this_00;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  uint i;
  ulong uVar11;
  float fVar12;
  undefined4 uVar15;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined4 uVar16;
  float fVar17;
  undefined1 auVar18 [16];
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  aiVector3t<float> aVar27;
  float local_238;
  float fStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 local_228;
  undefined4 uStack_224;
  char *local_1c0 [4];
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined8 extraout_XMM0_Qb;
  
  if (pcMesh == (aiMesh *)0x0) {
    __assert_fail("nullptr != pcMesh",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/PostProcessing/FixNormalsStep.cpp"
                  ,0x69,
                  "bool Assimp::FixInfacingNormalsProcess::ProcessMesh(aiMesh *, unsigned int)");
  }
  uVar9 = pcMesh->mNumVertices;
  if (uVar9 != 0 && pcMesh->mNormals != (aiVector3D *)0x0) {
    fVar23 = -1e+10;
    fVar21 = -1e+10;
    uVar15 = 0;
    uVar16 = 0;
    fVar20 = -1e+10;
    lVar10 = 0;
    fVar19 = 1e+10;
    fVar22 = -1e+10;
    local_238 = fVar23;
    fStack_234 = fVar21;
    uStack_230 = uVar15;
    uStack_22c = uVar16;
    fVar24 = 1e+10;
    auVar26 = _DAT_005b5800;
    for (uVar11 = 0; uVar11 < uVar9; uVar11 = uVar11 + 1) {
      paVar2 = pcMesh->mVertices;
      fVar12 = *(float *)((long)&paVar2->z + lVar10);
      fVar17 = fVar12;
      if (fVar19 <= fVar12) {
        fVar17 = fVar19;
      }
      fVar19 = fVar17;
      uVar8 = *(ulong *)((long)&paVar2->x + lVar10);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar8;
      auVar18._4_4_ = fStack_234;
      auVar18._0_4_ = local_238;
      auVar18._8_4_ = uStack_230;
      auVar18._12_4_ = uStack_22c;
      auVar18 = maxps(auVar14,auVar18);
      if (fVar12 <= fVar22) {
        fVar12 = fVar22;
      }
      fVar22 = fVar12;
      aVar27 = ::operator+((aiVector3t<float> *)((long)&paVar2->x + lVar10),
                           (aiVector3t<float> *)((long)&pcMesh->mNormals->x + lVar10));
      fVar17 = aVar27.z;
      auVar13._0_8_ = aVar27._0_8_;
      auVar13._8_8_ = extraout_XMM0_Qb;
      local_228 = (undefined4)uVar8;
      uStack_224 = (undefined4)(uVar8 >> 0x20);
      auVar25._4_4_ = local_228;
      auVar25._0_4_ = uStack_224;
      auVar25._8_4_ = aVar27.y;
      auVar25._12_4_ = aVar27.x;
      auVar26 = minps(auVar25,auVar26);
      fVar12 = fVar17;
      if (fVar24 <= fVar17) {
        fVar12 = fVar24;
      }
      auVar5._4_4_ = fVar21;
      auVar5._0_4_ = fVar23;
      auVar5._8_4_ = uVar15;
      auVar5._12_4_ = uVar16;
      auVar14 = maxps(auVar13,auVar5);
      if (fVar17 <= fVar20) {
        fVar17 = fVar20;
      }
      fVar20 = fVar17;
      uVar9 = pcMesh->mNumVertices;
      lVar10 = lVar10 + 0xc;
      local_238 = auVar18._0_4_;
      fStack_234 = auVar18._4_4_;
      uStack_230 = auVar18._8_4_;
      uStack_22c = auVar18._12_4_;
      fVar23 = auVar14._0_4_;
      fVar21 = auVar14._4_4_;
      uVar15 = auVar14._8_4_;
      uVar16 = auVar14._12_4_;
      fVar24 = fVar12;
    }
    fVar23 = fVar23 - auVar26._12_4_;
    local_238 = local_238 - auVar26._4_4_;
    if (local_238 <= 0.0 != 0.0 < fVar23) {
      fVar21 = fVar21 - auVar26._8_4_;
      fStack_234 = fStack_234 - auVar26._0_4_;
      if (0.0 < fVar21 != fStack_234 <= 0.0) {
        fVar22 = fVar22 - fVar19;
        if (0.0 < fVar20 - fVar24 != fVar22 <= 0.0) {
          fVar19 = fStack_234 * fVar22;
          if (fVar19 < 0.0) {
            fVar12 = sqrtf(fVar19);
          }
          else {
            fVar12 = SQRT(fVar19);
          }
          if (fVar12 * 0.05 <= local_238) {
            fVar12 = local_238 * fVar22;
            if (fVar12 < 0.0) {
              fVar12 = sqrtf(fVar12);
            }
            else {
              fVar12 = SQRT(fVar12);
            }
            if (fVar12 * 0.05 <= fStack_234) {
              fStack_234 = fStack_234 * local_238;
              if (fStack_234 < 0.0) {
                fStack_234 = sqrtf(fStack_234);
              }
              else {
                fStack_234 = SQRT(fStack_234);
              }
              if ((fStack_234 * 0.05 <= fVar22) &&
                 (ABS((fVar20 - fVar24) * fVar21 * fVar23) < ABS(local_238 * fVar19))) {
                bVar6 = DefaultLogger::isNullLogger();
                if (!bVar6) {
                  this_00 = DefaultLogger::get();
                  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                  basic_formatter<char[6]>(&local_1a0,(char (*) [6])0x5de46b);
                  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a0);
                  std::operator<<((ostream *)&local_1a0,
                                  ": Normals are facing inwards (or the mesh is planar)");
                  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a0);
                  std::__cxx11::stringbuf::str();
                  Logger::info(this_00,local_1c0[0]);
                  std::__cxx11::string::~string((string *)local_1c0);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
                }
                lVar10 = 0;
                for (uVar11 = 0; uVar11 < pcMesh->mNumVertices; uVar11 = uVar11 + 1) {
                  aiVector3t<float>::operator*=
                            ((aiVector3t<float> *)((long)&pcMesh->mNormals->x + lVar10),-1.0);
                  lVar10 = lVar10 + 0xc;
                }
                for (uVar11 = 0; uVar11 < pcMesh->mNumFaces; uVar11 = uVar11 + 1) {
                  paVar3 = pcMesh->mFaces;
                  iVar7 = -1;
                  for (uVar8 = 0; uVar9 = paVar3[uVar11].mNumIndices, uVar8 < uVar9 >> 1;
                      uVar8 = uVar8 + 1) {
                    puVar4 = paVar3[uVar11].mIndices;
                    uVar9 = uVar9 + iVar7;
                    uVar1 = puVar4[uVar8];
                    puVar4[uVar8] = puVar4[uVar9];
                    puVar4[uVar9] = uVar1;
                    iVar7 = iVar7 + -1;
                  }
                }
                return true;
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool FixInfacingNormalsProcess::ProcessMesh( aiMesh* pcMesh, unsigned int index)
{
    ai_assert(nullptr != pcMesh);

    // Nothing to do if there are no model normals
    if (!pcMesh->HasNormals()) {
        return false;
    }

    // Compute the bounding box of both the model vertices + normals and
    // the unmodified model vertices. Then check whether the first BB
    // is smaller than the second. In this case we can assume that the
    // normals need to be flipped, although there are a few special cases ..
    // convex, concave, planar models ...

    aiVector3D vMin0 (1e10f,1e10f,1e10f);
    aiVector3D vMin1 (1e10f,1e10f,1e10f);
    aiVector3D vMax0 (-1e10f,-1e10f,-1e10f);
    aiVector3D vMax1 (-1e10f,-1e10f,-1e10f);

    for (unsigned int i = 0; i < pcMesh->mNumVertices;++i)
    {
        vMin1.x = std::min(vMin1.x,pcMesh->mVertices[i].x);
        vMin1.y = std::min(vMin1.y,pcMesh->mVertices[i].y);
        vMin1.z = std::min(vMin1.z,pcMesh->mVertices[i].z);

        vMax1.x = std::max(vMax1.x,pcMesh->mVertices[i].x);
        vMax1.y = std::max(vMax1.y,pcMesh->mVertices[i].y);
        vMax1.z = std::max(vMax1.z,pcMesh->mVertices[i].z);

        const aiVector3D vWithNormal = pcMesh->mVertices[i] + pcMesh->mNormals[i];

        vMin0.x = std::min(vMin0.x,vWithNormal.x);
        vMin0.y = std::min(vMin0.y,vWithNormal.y);
        vMin0.z = std::min(vMin0.z,vWithNormal.z);

        vMax0.x = std::max(vMax0.x,vWithNormal.x);
        vMax0.y = std::max(vMax0.y,vWithNormal.y);
        vMax0.z = std::max(vMax0.z,vWithNormal.z);
    }

    const float fDelta0_x = (vMax0.x - vMin0.x);
    const float fDelta0_y = (vMax0.y - vMin0.y);
    const float fDelta0_z = (vMax0.z - vMin0.z);

    const float fDelta1_x = (vMax1.x - vMin1.x);
    const float fDelta1_y = (vMax1.y - vMin1.y);
    const float fDelta1_z = (vMax1.z - vMin1.z);

    // Check whether the boxes are overlapping
    if ((fDelta0_x > 0.0f) != (fDelta1_x > 0.0f))return false;
    if ((fDelta0_y > 0.0f) != (fDelta1_y > 0.0f))return false;
    if ((fDelta0_z > 0.0f) != (fDelta1_z > 0.0f))return false;

    // Check whether this is a planar surface
    const float fDelta1_yz = fDelta1_y * fDelta1_z;

    if (fDelta1_x < 0.05f * std::sqrt( fDelta1_yz ))return false;
    if (fDelta1_y < 0.05f * std::sqrt( fDelta1_z * fDelta1_x ))return false;
    if (fDelta1_z < 0.05f * std::sqrt( fDelta1_y * fDelta1_x ))return false;

    // now compare the volumes of the bounding boxes
    if (std::fabs(fDelta0_x * fDelta0_y * fDelta0_z) < std::fabs(fDelta1_x * fDelta1_yz)) {
        if (!DefaultLogger::isNullLogger()) {
            ASSIMP_LOG_INFO_F("Mesh ", index, ": Normals are facing inwards (or the mesh is planar)", index);
        }

        // Invert normals
        for (unsigned int i = 0; i < pcMesh->mNumVertices;++i)
            pcMesh->mNormals[i] *= -1.0f;

        // ... and flip faces
        for (unsigned int i = 0; i < pcMesh->mNumFaces;++i)
        {
            aiFace& face = pcMesh->mFaces[i];
            for( unsigned int b = 0; b < face.mNumIndices / 2; b++)
                std::swap( face.mIndices[b], face.mIndices[ face.mNumIndices - 1 - b]);
        }
        return true;
    }
    return false;
}